

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeReader.cpp
# Opt level: O0

PropertyIdArray *
Js::ByteCodeReader::ReadPropertyIdArrayWithLock(uint offset,FunctionBody *functionBody)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  ByteBlock *pBVar4;
  byte *pbVar5;
  size_t sVar6;
  undefined4 *puVar7;
  PropertyIdArray *propIds;
  FunctionBody *functionBody_local;
  uint offset_local;
  
  pBVar4 = FunctionBody::GetAuxiliaryDataWithLock(functionBody);
  pbVar5 = ByteBlock::GetBuffer(pBVar4);
  sVar6 = PropertyIdArray::GetDataSize((PropertyIdArray *)(pbVar5 + offset));
  pBVar4 = FunctionBody::GetAuxiliaryDataWithLock(functionBody);
  uVar3 = ByteBlock::GetLength(pBVar4);
  if ((ulong)uVar3 < offset + sVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0x112,
                                "(offset + propIds->GetDataSize() <= functionBody->GetAuxiliaryDataWithLock()->GetLength())"
                                ,
                                "offset + propIds->GetDataSize() <= functionBody->GetAuxiliaryDataWithLock()->GetLength()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  return (PropertyIdArray *)(pbVar5 + offset);
}

Assistant:

const Js::PropertyIdArray * ByteCodeReader::ReadPropertyIdArrayWithLock(uint offset, FunctionBody * functionBody)
    {
        Js::PropertyIdArray const * propIds = (Js::PropertyIdArray const *)(functionBody->GetAuxiliaryDataWithLock()->GetBuffer() + offset);
        Assert(offset + propIds->GetDataSize() <= functionBody->GetAuxiliaryDataWithLock()->GetLength());
        return propIds;
    }